

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

LessThanLayerParams * __thiscall
CoreML::Specification::LessThanLayerParams::New(LessThanLayerParams *this,Arena *arena)

{
  LessThanLayerParams *this_00;
  
  this_00 = (LessThanLayerParams *)operator_new(0x18);
  LessThanLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LessThanLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LessThanLayerParams* LessThanLayerParams::New(::google::protobuf::Arena* arena) const {
  LessThanLayerParams* n = new LessThanLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}